

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_replace_value(JSON_Array *array,size_t ix,JSON_Value *value)

{
  JSON_Array *pJVar1;
  JSON_Value *pJVar2;
  JSON_Value *in_RDX;
  JSON_Array *in_RSI;
  JSON_Array *in_RDI;
  JSON_Array *array_00;
  
  if ((((in_RDI != (JSON_Array *)0x0) && (in_RDX != (JSON_Value *)0x0)) &&
      (in_RDX->parent == (JSON_Value *)0x0)) &&
     (array_00 = in_RSI, pJVar1 = (JSON_Array *)json_array_get_count(in_RDI), in_RSI < pJVar1)) {
    json_array_get_value(array_00,(size_t)in_RDX);
    json_value_free(in_RDX);
    pJVar2 = json_array_get_wrapping_value(in_RDI);
    in_RDX->parent = pJVar2;
    in_RDI->items[(long)array_00] = in_RDX;
    return 0;
  }
  return -1;
}

Assistant:

JSON_Status json_array_replace_value(JSON_Array *array, size_t ix, JSON_Value *value) {
    if (array == NULL || value == NULL || value->parent != NULL || ix >= json_array_get_count(array)) {
        return JSONFailure;
    }
    json_value_free(json_array_get_value(array, ix));
    value->parent = json_array_get_wrapping_value(array);
    array->items[ix] = value;
    return JSONSuccess;
}